

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSamplerStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::SamplerStateQueryTests::init
          (SamplerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  QueryType QVar1;
  TestContext *pTVar2;
  RenderContext *pRVar3;
  bool bVar4;
  undefined4 uVar5;
  TestNode *pTVar6;
  long *plVar7;
  long lVar8;
  TestNode *node;
  ulong *puVar9;
  size_type *psVar10;
  bool bVar11;
  TesterType TVar12;
  allocator<char> local_d9;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  string local_98;
  TestNode *local_78;
  TestNode *local_70;
  TestNode *local_68;
  string local_60;
  ulong local_40;
  long local_38;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"set_value",
             "Set value and query it");
  local_78 = pTVar6;
  local_68 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar8 = 0;
  do {
    local_38 = lVar8;
    if (init::states[lVar8].newInGLES31 == true) {
      local_70 = (TestNode *)(init::states + lVar8);
      TVar12 = init::states[lVar8].tester;
      local_40 = (ulong)TVar12;
      if (TVar12 - TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER < 3) {
        lVar8 = 0;
        bVar4 = true;
        do {
          bVar11 = bVar4;
          QVar1 = init::nonPureVerifiers[lVar8];
          pTVar2 = local_68->m_testCtx;
          pRVar3 = ((Context *)local_68[1]._vptr_TestNode)->m_renderCtx;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_d8 = &local_c8;
          puVar9 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar9) {
            local_c8 = *puVar9;
            lStack_c0 = plVar7[3];
          }
          else {
            local_c8 = *puVar9;
            local_d8 = (ulong *)*plVar7;
          }
          local_d0 = plVar7[1];
          *plVar7 = (long)puVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_b8.field_2._M_allocated_capacity = *psVar10;
            local_b8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar10;
            local_b8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_b8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,(char *)local_70->m_testCtx,&local_d9);
          pTVar6 = &gls::TextureStateQueryTests::createSamplerParamTest
                              (pTVar2,pRVar3,&local_b8,&local_60,QVar1,(TesterType)local_40)->
                    super_TestNode;
          tcu::TestNode::addChild(local_78,pTVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          lVar8 = 1;
          bVar4 = false;
        } while (bVar11);
      }
      else if (TVar12 == TESTER_TEXTURE_BORDER_COLOR) {
        lVar8 = 0;
        do {
          QVar1 = *(QueryType *)((long)init::vectorVerifiers + lVar8);
          pTVar2 = local_68->m_testCtx;
          pRVar3 = ((Context *)local_68[1]._vptr_TestNode)->m_renderCtx;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_d8 = &local_c8;
          puVar9 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar9) {
            local_c8 = *puVar9;
            lStack_c0 = plVar7[3];
          }
          else {
            local_c8 = *puVar9;
            local_d8 = (ulong *)*plVar7;
          }
          local_d0 = plVar7[1];
          *plVar7 = (long)puVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_b8.field_2._M_allocated_capacity = *psVar10;
            local_b8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar10;
            local_b8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_b8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,(char *)local_70->m_testCtx,&local_d9);
          pTVar6 = &gls::TextureStateQueryTests::createSamplerParamTest
                              (pTVar2,pRVar3,&local_b8,&local_60,QVar1,TESTER_TEXTURE_BORDER_COLOR)
                    ->super_TestNode;
          tcu::TestNode::addChild(local_78,pTVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x10);
      }
      else {
        lVar8 = 0;
        do {
          QVar1 = *(QueryType *)((long)init::scalarVerifiers + lVar8);
          pTVar2 = local_68->m_testCtx;
          pRVar3 = ((Context *)local_68[1]._vptr_TestNode)->m_renderCtx;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_d8 = &local_c8;
          puVar9 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar9) {
            local_c8 = *puVar9;
            lStack_c0 = plVar7[3];
          }
          else {
            local_c8 = *puVar9;
            local_d8 = (ulong *)*plVar7;
          }
          local_d0 = plVar7[1];
          *plVar7 = (long)puVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_b8.field_2._M_allocated_capacity = *psVar10;
            local_b8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar10;
            local_b8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_b8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,(char *)local_70->m_testCtx,&local_d9);
          pTVar6 = &gls::TextureStateQueryTests::createSamplerParamTest
                              (pTVar2,pRVar3,&local_b8,&local_60,QVar1,(TesterType)local_40)->
                    super_TestNode;
          tcu::TestNode::addChild(local_78,pTVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x10);
      }
    }
    lVar8 = local_38 + 1;
  } while (lVar8 != 0xe);
  uVar5 = 1;
  lVar8 = 0;
  do {
    local_78 = (TestNode *)CONCAT44(local_78._4_4_,uVar5);
    node = (TestNode *)operator_new(0x70);
    pTVar6 = local_68;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,local_68->m_testCtx,init::pureSetters[lVar8].name,
               init::pureSetters[lVar8].desc);
    local_70 = node;
    tcu::TestNode::addChild(pTVar6,node);
    QVar1 = init::pureSetters[lVar8].verifier;
    lVar8 = 0;
    do {
      if (QVar1 == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER) {
        TVar12 = *(TesterType *)((long)&init::pureStates[0].uintTester + lVar8);
      }
      else {
        TVar12 = TESTER_LAST;
        if (QVar1 == QUERY_SAMPLER_PARAM_PURE_INTEGER) {
          TVar12 = *(TesterType *)((long)&init::pureStates[0].intTester + lVar8);
        }
      }
      local_d8 = &local_c8;
      pTVar2 = local_68->m_testCtx;
      pRVar3 = ((Context *)local_68[1]._vptr_TestNode)->m_renderCtx;
      local_d0 = 0;
      local_c8 = local_c8 & 0xffffffffffffff00;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar10;
        local_b8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,*(char **)((long)&init::pureStates[0].desc + lVar8),
                 (allocator<char> *)&local_60);
      pTVar6 = &gls::TextureStateQueryTests::createSamplerParamTest
                          (pTVar2,pRVar3,&local_b8,&local_98,QVar1,TVar12)->super_TestNode;
      tcu::TestNode::addChild(local_70,pTVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0xf0);
    lVar8 = 1;
    uVar5 = 0;
  } while (((ulong)local_78 & 1) != 0);
  return 0;
}

Assistant:

void SamplerStateQueryTests::init (void)
{
	using namespace gls::TextureStateQueryTests;

	static const QueryType scalarVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT,
		QUERY_SAMPLER_PARAM_PURE_INTEGER,
		QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER,
	};
	static const QueryType nonPureVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT,
	};
	static const QueryType vectorVerifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER_VEC4,
		QUERY_SAMPLER_PARAM_FLOAT_VEC4,
		QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4,
		QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4,
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		targetGroup->addChild(X);															\
	}

	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
		bool		newInGLES31;
	} states[] =
	{
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S,					false	},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T,					false	},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R,					false	},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER,				false	},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER,				false	},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD,					false	},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD,					false	},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE,			false	},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC,			false	},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT,			true	},
		{ "texture_border_color",			"TEXTURE_BORDER_COLOR",				TESTER_TEXTURE_BORDER_COLOR,			true	},
		{ "texture_wrap_s_clamp_to_border",	"TEXTURE_WRAP_S_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_t_clamp_to_border",	"TEXTURE_WRAP_T_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_r_clamp_to_border",	"TEXTURE_WRAP_R_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER,	true	},
	};
	static const struct
	{
		const char* name;
		const char* desc;
		QueryType	verifier;
	} pureSetters[] =
	{
		{ "set_pure_int",	"Set state with pure int",			QUERY_SAMPLER_PARAM_PURE_INTEGER			},
		{ "set_pure_uint",	"Set state with pure unsigned int",	QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER	},
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	intTester;
		TesterType	uintTester;
	} pureStates[] =
	{
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S_SET_PURE_INT,				TESTER_TEXTURE_WRAP_S_SET_PURE_UINT					},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T_SET_PURE_INT,				TESTER_TEXTURE_WRAP_T_SET_PURE_UINT					},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R_SET_PURE_INT,				TESTER_TEXTURE_WRAP_R_SET_PURE_UINT					},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MAG_FILTER_SET_PURE_UINT				},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MIN_FILTER_SET_PURE_UINT				},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD_SET_PURE_INT,			TESTER_TEXTURE_MIN_LOD_SET_PURE_UINT				},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD_SET_PURE_INT,			TESTER_TEXTURE_MAX_LOD_SET_PURE_UINT				},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_MODE_SET_PURE_UINT			},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_UINT			},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_INT,	TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_UINT		},
		// \note texture_border_color is already checked
		// \note texture_wrap_*_clamp_to_border brings no additional coverage
	};

	// set_value
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, "set_value", "Set value and query it");
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
		{
			// already tested in gles3
			if (!states[stateNdx].newInGLES31)
				continue;

			if (isExtendedParamQuery(states[stateNdx].tester))
			{
				// no need to cover for all getters if the only thing new is the param name
				FOR_EACH_VERIFIER(nonPureVerifiers, createSamplerParamTest(m_testCtx,
																		   m_context.getRenderContext(),
																		   std::string() + states[stateNdx].name + verifierSuffix,
																		   states[stateNdx].desc,
																		   verifier,
																		   states[stateNdx].tester));
			}
			else if (isIsVectorQuery(states[stateNdx].tester))
			{
				FOR_EACH_VERIFIER(vectorVerifiers, createSamplerParamTest(m_testCtx,
																		  m_context.getRenderContext(),
																		  std::string() + states[stateNdx].name + verifierSuffix,
																		  states[stateNdx].desc,
																		  verifier,
																		  states[stateNdx].tester));
			}
			else
			{
				FOR_EACH_VERIFIER(scalarVerifiers, createSamplerParamTest(m_testCtx,
																		  m_context.getRenderContext(),
																		  std::string() + states[stateNdx].name + verifierSuffix,
																		  states[stateNdx].desc,
																		  verifier,
																		  states[stateNdx].tester));
			}
		}
	}

#undef FOR_EACH_VERIFIER

	// set_pure_uint
	// set_pure_int
	for (int setterNdx = 0; setterNdx < DE_LENGTH_OF_ARRAY(pureSetters); ++setterNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, pureSetters[setterNdx].name, pureSetters[setterNdx].desc);
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(pureStates); ++stateNdx)
		{
			const TesterType	tester	= (pureSetters[setterNdx].verifier == QUERY_SAMPLER_PARAM_PURE_INTEGER)				? (pureStates[stateNdx].intTester)
										: (pureSetters[setterNdx].verifier == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER)	? (pureStates[stateNdx].uintTester)
										: (TESTER_LAST);

			targetGroup->addChild(createSamplerParamTest(m_testCtx,
														 m_context.getRenderContext(),
														 std::string() + pureStates[stateNdx].name,
														 pureStates[stateNdx].desc,
														 pureSetters[setterNdx].verifier,
														 tester));
		}
	}
}